

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
          (EpsCopyOutputStream *this,void *data,int size,uint8_t *ptr)

{
  ptrdiff_t pVar1;
  size_t __n;
  
  pVar1 = GetSize(this,ptr);
  if ((int)pVar1 < size) {
    do {
      size = size - (int)pVar1;
      __n = (size_t)(int)pVar1;
      memcpy(ptr,data,__n);
      data = (void *)((long)data + __n);
      ptr = EnsureSpaceFallback(this,ptr + __n);
      pVar1 = GetSize(this,ptr);
    } while ((int)pVar1 < size);
  }
  memcpy(ptr,data,(long)size);
  return ptr + size;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteRawFallback(const void* data, int size,
                                             uint8_t* ptr) {
  int s = GetSize(ptr);
  while (s < size) {
    std::memcpy(ptr, data, s);
    size -= s;
    data = static_cast<const uint8_t*>(data) + s;
    ptr = EnsureSpaceFallback(ptr + s);
    s = GetSize(ptr);
  }
  std::memcpy(ptr, data, size);
  return ptr + size;
}